

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_type(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlChar *res;
  xmlNodePtr cur;
  PyObject *obj;
  PyObject *resultobj;
  PyObject *args_local;
  PyObject *self_local;
  
  local_40 = (xmlChar *)0x0;
  resultobj = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:last",&cur);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (cur == (xmlNodePtr)&_Py_NoneStruct) {
      local_48 = (xmlChar *)0x0;
    }
    else {
      local_48 = cur->name;
    }
    if (local_48 == (xmlChar *)0x0) {
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
    else {
      switch(*(undefined4 *)(local_48 + 8)) {
      case 1:
        local_40 = "element";
        break;
      case 2:
        local_40 = "attribute";
        break;
      case 3:
        local_40 = "text";
        break;
      case 4:
        local_40 = "cdata";
        break;
      case 5:
        local_40 = "entity_ref";
        break;
      case 6:
        local_40 = "entity";
        break;
      case 7:
        local_40 = "pi";
        break;
      case 8:
        local_40 = "comment";
        break;
      case 9:
        local_40 = "document_xml";
        break;
      case 10:
        local_40 = "doctype";
        break;
      case 0xb:
        local_40 = "fragment";
        break;
      case 0xc:
        local_40 = "notation";
        break;
      case 0xd:
        local_40 = "document_html";
        break;
      case 0xe:
        local_40 = "dtd";
        break;
      case 0xf:
        local_40 = "elem_decl";
        break;
      case 0x10:
        local_40 = "attribute_decl";
        break;
      case 0x11:
        local_40 = "entity_decl";
        break;
      case 0x12:
        local_40 = "namespace";
        break;
      case 0x13:
        local_40 = "xinclude_start";
        break;
      case 0x14:
        local_40 = "xinclude_end";
      }
      self_local = libxml_constxmlCharPtrWrap(local_40);
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_type(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *resultobj, *obj;
    xmlNodePtr cur;
    const xmlChar *res = NULL;

    if (!PyArg_ParseTuple(args, (char *) "O:last", &obj))
        return NULL;
    cur = PyxmlNode_Get(obj);
    if (cur == NULL) {
        Py_INCREF(Py_None);
	return (Py_None);
    }

    switch (cur->type) {
        case XML_ELEMENT_NODE:
            res = (const xmlChar *) "element";
            break;
        case XML_ATTRIBUTE_NODE:
            res = (const xmlChar *) "attribute";
            break;
        case XML_TEXT_NODE:
            res = (const xmlChar *) "text";
            break;
        case XML_CDATA_SECTION_NODE:
            res = (const xmlChar *) "cdata";
            break;
        case XML_ENTITY_REF_NODE:
            res = (const xmlChar *) "entity_ref";
            break;
        case XML_ENTITY_NODE:
            res = (const xmlChar *) "entity";
            break;
        case XML_PI_NODE:
            res = (const xmlChar *) "pi";
            break;
        case XML_COMMENT_NODE:
            res = (const xmlChar *) "comment";
            break;
        case XML_DOCUMENT_NODE:
            res = (const xmlChar *) "document_xml";
            break;
        case XML_DOCUMENT_TYPE_NODE:
            res = (const xmlChar *) "doctype";
            break;
        case XML_DOCUMENT_FRAG_NODE:
            res = (const xmlChar *) "fragment";
            break;
        case XML_NOTATION_NODE:
            res = (const xmlChar *) "notation";
            break;
        case XML_HTML_DOCUMENT_NODE:
            res = (const xmlChar *) "document_html";
            break;
        case XML_DTD_NODE:
            res = (const xmlChar *) "dtd";
            break;
        case XML_ELEMENT_DECL:
            res = (const xmlChar *) "elem_decl";
            break;
        case XML_ATTRIBUTE_DECL:
            res = (const xmlChar *) "attribute_decl";
            break;
        case XML_ENTITY_DECL:
            res = (const xmlChar *) "entity_decl";
            break;
        case XML_NAMESPACE_DECL:
            res = (const xmlChar *) "namespace";
            break;
        case XML_XINCLUDE_START:
            res = (const xmlChar *) "xinclude_start";
            break;
        case XML_XINCLUDE_END:
            res = (const xmlChar *) "xinclude_end";
            break;
    }

    resultobj = libxml_constxmlCharPtrWrap(res);
    return resultobj;
}